

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O1

bool __thiscall
RootIndexProxyModel::dropMimeData
          (RootIndexProxyModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  undefined1 uVar1;
  long lVar2;
  long *plVar3;
  QModelIndex local_48;
  
  lVar2 = QAbstractProxyModel::sourceModel();
  if (lVar2 == 0) {
    uVar1 = 0;
  }
  else {
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m = (QAbstractItemModel *)0x0;
    if (((parent->r < 0) || (parent->c < 0)) || (parent->m == (QAbstractItemModel *)0x0)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->m_dptr->m_rootIndex);
    }
    else {
      (**(code **)(*(long *)this + 400))(&local_48,this,parent);
    }
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    uVar1 = (**(code **)(*plVar3 + 0xe0))(plVar3,data,action,row,column,&local_48);
  }
  return (bool)uVar1;
}

Assistant:

bool RootIndexProxyModel::dropMimeData(const QMimeData *data, Qt::DropAction action, int row, int column, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return 0;
    Q_D(const RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->dropMimeData(data, action, row, column, sourceParent);
}